

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.h
# Opt level: O2

string * __thiscall re2c::Opt::yychConversion_abi_cxx11_(string *__return_storage_ptr__,Opt *this)

{
  opt_t *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  poVar1 = realopt_t::operator->(&this->realopt);
  if (poVar1->yychConversion == true) {
    poVar1 = realopt_t::operator->(&this->realopt);
    std::operator+(&local_30,"(",&poVar1->yyctype);
    std::operator+(__return_storage_ptr__,&local_30,")");
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string yychConversion ()
	{
		return realopt->yychConversion
			? "(" + realopt->yyctype + ")"
			: "";
	}